

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

word Abc_SopToTruth(char *pSop,int nInputs)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  
  uVar2 = Abc_SopGetVarNum(pSop);
  if (6 < uVar2) {
    __assert_fail("nVars >= 0 && nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x49a,"word Abc_SopToTruth(char *, int)");
  }
  if (uVar2 == nInputs) {
    uVar8 = 0;
    lVar4 = 0;
    while( true ) {
      pcVar6 = pSop + (int)lVar4;
      uVar5 = 0xffffffffffffffff;
      for (lVar7 = 0; (ulong)(uint)nInputs << 3 != lVar7; lVar7 = lVar7 + 8) {
        cVar1 = *pcVar6;
        if (cVar1 != '-') {
          if (cVar1 == '0') {
            uVar5 = uVar5 & ~*(ulong *)((long)Abc_SopToTruth::Truth + lVar7);
          }
          else {
            if (cVar1 != '1') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                            ,0x4a5,"word Abc_SopToTruth(char *, int)");
            }
            uVar5 = uVar5 & *(ulong *)((long)Abc_SopToTruth::Truth + lVar7);
          }
        }
        pcVar6 = pcVar6 + 1;
      }
      lVar7 = (long)((int)lVar4 + nInputs);
      if (pSop[lVar7] != ' ') {
        __assert_fail("pSop[lit] == \' \'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x4a8,"word Abc_SopToTruth(char *, int)");
      }
      if (pSop[lVar7 + 2] != '\n') break;
      uVar8 = uVar8 | uVar5;
      lVar4 = lVar7 + 3;
      if (pSop[lVar7 + 3] == '\0') {
        iVar3 = Abc_SopIsComplement(pSop);
        return uVar8 ^ (long)-iVar3;
      }
    }
    __assert_fail("pSop[lit] == \'\\n\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x4ab,"word Abc_SopToTruth(char *, int)");
  }
  __assert_fail("nVars == nInputs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                ,0x49b,"word Abc_SopToTruth(char *, int)");
}

Assistant:

word Abc_SopToTruth( char * pSop, int nInputs )
{
    static word Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    word Cube, Result = 0;
    int v, lit = 0;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( nVars >= 0 && nVars <= 6 );
    assert( nVars == nInputs );
    do {
        Cube = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                Cube &=  Truth[v];
            else if ( pSop[lit] == '0' )
                Cube &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        Result |= Cube;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
        Result = ~Result;
    return Result;
}